

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O1

int arkRelax(ARKodeMem ark_mem,int *relax_fails,sunrealtype *dsm_inout)

{
  long *plVar1;
  ARKodeRelaxMem pAVar2;
  ARKodeRelaxMem pAVar3;
  void *pvVar4;
  ARKodeRelaxMem pAVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  N_Vector p_Var11;
  double dVar12;
  double dVar13;
  N_Vector in_XMM1_Qa;
  N_Vector p_Var14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  N_Vector p_Var21;
  undefined8 uVar22;
  N_Vector p_Var23;
  N_Vector p_Var24;
  N_Vector p_Var25;
  sunrealtype fa;
  N_Vector local_a8;
  N_Vector local_a0;
  N_Vector local_98;
  double dStack_90;
  N_Vector local_88;
  int *local_80;
  double *local_78;
  N_Vector local_70;
  N_Vector local_68;
  double dStack_60;
  N_Vector local_58;
  undefined8 uStack_50;
  N_Vector local_48;
  double dStack_40;
  
  pAVar2 = ark_mem->relax_mem;
  if (pAVar2 == (ARKodeRelaxMem)0x0) {
    arkProcessError(ark_mem,-0x2c,0x364,"arkRelax",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"Relaxation memory is NULL.");
    return -0x2c;
  }
  iVar7 = (*pAVar2->delta_e_fn)
                    (ark_mem,pAVar2->relax_jac_fn,&pAVar2->num_relax_jac_evals,&pAVar2->delta_e);
  if (iVar7 != 0) goto LAB_0015c25a;
  in_XMM1_Qa = (N_Vector)0xbff0000000000000;
  N_VLinearSum(0x3ff0000000000000,ark_mem->ycur,ark_mem->yn,ark_mem->tempv2);
  iVar7 = (*pAVar2->relax_fn)(ark_mem->yn,&pAVar2->e_old,ark_mem->user_data);
  pAVar2->num_relax_fn_evals = pAVar2->num_relax_fn_evals + 1;
  if (iVar7 < 0) {
    iVar7 = -0x2d;
    goto LAB_0015c25a;
  }
  if (iVar7 != 0) {
    iVar7 = 1;
    goto LAB_0015c25a;
  }
  pAVar2->relax_param = pAVar2->relax_param_prev;
  if (pAVar2->solver == ARK_RELAX_NEWTON) {
    pAVar3 = ark_mem->relax_mem;
    local_80 = relax_fails;
    local_78 = dsm_inout;
    if (0 < pAVar3->max_iters) {
      local_70 = (N_Vector)&pAVar3->res;
      iVar9 = 0;
      do {
        iVar7 = arkRelaxResidual(pAVar3->relax_param,(sunrealtype *)local_70,ark_mem);
        if (iVar7 != 0) goto LAB_0015caa6;
        in_XMM1_Qa = (N_Vector)pAVar3->res_tol;
        if (ABS(pAVar3->res) < (double)in_XMM1_Qa) goto LAB_0015c727;
        local_98 = (N_Vector)CONCAT44(local_98._4_4_,iVar9);
        in_XMM1_Qa = (N_Vector)pAVar3->relax_param;
        local_88 = ark_mem->tempv2;
        p_Var24 = ark_mem->tempv3;
        p_Var11 = ark_mem->tempv4;
        local_68 = (N_Vector)ark_mem->relax_mem->delta_e;
        pvVar4 = ark_mem->user_data;
        N_VLinearSum(0x3ff0000000000000,ark_mem->yn,local_88,p_Var24);
        local_58 = p_Var11;
        iVar9 = (*ark_mem->relax_mem->relax_jac_fn)(p_Var24,p_Var11,pvVar4);
        plVar1 = &ark_mem->relax_mem->num_relax_jac_evals;
        *plVar1 = *plVar1 + 1;
        if (iVar9 < 0) {
          iVar7 = -0x2e;
LAB_0015c5c6:
          bVar6 = false;
        }
        else {
          iVar7 = 0;
          if (iVar9 != 0) {
            iVar7 = 2;
            goto LAB_0015c5c6;
          }
          dVar10 = (double)N_VDotProd(local_88,local_58);
          pAVar3->jac = dVar10 - (double)local_68;
          bVar6 = true;
        }
        if (!bVar6) goto LAB_0015caa6;
        in_XMM1_Qa = (N_Vector)(ABS(pAVar3->relax_param) * pAVar3->rel_tol + pAVar3->abs_tol);
        dVar10 = pAVar3->res / pAVar3->jac;
        pAVar3->relax_param = pAVar3->relax_param - dVar10;
        pAVar3->nls_iters = pAVar3->nls_iters + 1;
        if (ABS(dVar10) < (double)in_XMM1_Qa) goto LAB_0015c727;
        iVar9 = (int)local_98 + 1;
      } while (iVar9 < ark_mem->relax_mem->max_iters);
    }
  }
  else {
    if (pAVar2->solver != ARK_RELAX_BRENT) {
      iVar7 = -0x16;
      goto LAB_0015c25a;
    }
    pAVar3 = ark_mem->relax_mem;
    dStack_90 = 0.0;
    local_98 = (N_Vector)(pAVar3->relax_param * 1.1);
    p_Var24 = (N_Vector)(pAVar3->relax_param * 0.9);
    iVar9 = 10;
    iVar7 = -0x2d;
    local_80 = relax_fails;
    local_78 = dsm_inout;
    do {
      local_68 = local_98;
      local_98 = p_Var24;
      dStack_60 = dStack_90;
      iVar8 = arkRelaxResidual((sunrealtype)p_Var24,(sunrealtype *)&local_a0,ark_mem);
      plVar1 = &ark_mem->relax_mem->num_relax_fn_evals;
      *plVar1 = *plVar1 + 1;
      if (iVar8 < 0) goto LAB_0015caa6;
      if (iVar8 != 0) goto LAB_0015caa1;
      in_XMM1_Qa = (N_Vector)ABS((double)local_a0);
      p_Var24 = local_a0;
      if ((double)in_XMM1_Qa < pAVar3->res_tol) goto LAB_0015c71b;
      p_Var11 = local_68;
      dVar10 = dStack_60;
      p_Var24 = local_98;
      if ((double)local_a0 < 0.0) break;
      local_a8 = local_a0;
      p_Var24 = (N_Vector)((double)local_98 * 0.9);
      iVar9 = iVar9 + -1;
      p_Var11 = local_98;
      dVar10 = dStack_90;
    } while (iVar9 != 0);
    local_98 = p_Var24;
    in_XMM1_Qa = (N_Vector)0x0;
    if ((double)local_a0 <= 0.0) {
      iVar9 = 10;
      dStack_90 = dVar10;
      do {
        local_88 = local_98;
        local_98 = p_Var11;
        iVar8 = arkRelaxResidual((sunrealtype)p_Var11,(sunrealtype *)&local_a8,ark_mem);
        pAVar5 = ark_mem->relax_mem;
        plVar1 = &pAVar5->num_relax_fn_evals;
        *plVar1 = *plVar1 + 1;
        if (iVar8 < 0) goto LAB_0015caa6;
        if (iVar8 != 0) goto LAB_0015caa1;
        in_XMM1_Qa = (N_Vector)ABS((double)local_a8);
        p_Var24 = local_a8;
        if ((double)in_XMM1_Qa < pAVar3->res_tol) goto LAB_0015c71b;
        if (0.0 < (double)local_a8) {
          p_Var11 = local_98;
          local_98 = local_88;
          dVar10 = 0.0;
          break;
        }
        local_a0 = local_a8;
        p_Var11 = (N_Vector)((double)local_98 * 1.1);
        iVar9 = iVar9 + -1;
        dVar10 = dStack_90;
      } while (iVar9 != 0);
      in_XMM1_Qa = (N_Vector)0x0;
      if ((0.0 <= (double)local_a8) && (0 < pAVar5->max_iters)) {
        iVar9 = 0;
        dVar12 = dStack_90;
        p_Var24 = local_a0;
        uVar22 = 0;
        p_Var23 = (N_Vector)0x0;
        p_Var25 = local_98;
        p_Var14 = local_98;
        dVar13 = dVar10;
        do {
          if (((0.0 < (double)p_Var24) && (0.0 < (double)local_a8)) ||
             (((double)p_Var24 < 0.0 && ((double)local_a8 < 0.0)))) {
            uVar22 = 0;
            in_XMM1_Qa = (N_Vector)((double)p_Var11 - (double)p_Var14);
            p_Var24 = local_a0;
            p_Var23 = in_XMM1_Qa;
            p_Var25 = p_Var14;
            dVar10 = dVar13;
          }
          local_98 = p_Var11;
          dVar13 = dVar12;
          p_Var21 = p_Var24;
          if (ABS((double)p_Var24) < ABS((double)local_a8)) {
            local_a0 = local_a8;
            uVar22 = 0;
            local_98 = p_Var25;
            dVar13 = dVar10;
            p_Var14 = p_Var11;
            p_Var21 = local_a8;
            p_Var25 = p_Var11;
            dVar10 = dVar12;
            local_a8 = p_Var24;
          }
          dVar12 = ABS((double)local_98) * pAVar3->rel_tol + pAVar3->abs_tol * 0.5;
          p_Var11 = (N_Vector)(((double)p_Var25 - (double)local_98) * 0.5);
          p_Var24 = local_a8;
          if ((ABS((double)p_Var11) < dVar12) || (ABS((double)local_a8) < pAVar3->res_tol))
          goto LAB_0015c71b;
          local_70 = p_Var11;
          local_48 = p_Var11;
          dStack_40 = dVar10;
          if ((dVar12 <= ABS((double)in_XMM1_Qa)) && (ABS((double)local_a8) < ABS((double)local_a0))
             ) {
            dVar15 = (double)local_a8 / (double)local_a0;
            dVar20 = (double)p_Var11 + (double)p_Var11;
            if (((double)p_Var14 != (double)p_Var25) ||
               (NAN((double)p_Var14) || NAN((double)p_Var25))) {
              auVar18._8_8_ = local_a8;
              auVar18._0_8_ = local_a0;
              auVar19._8_8_ = p_Var21;
              auVar19._0_8_ = p_Var21;
              auVar19 = divpd(auVar18,auVar19);
              dVar17 = auVar19._0_8_;
              dVar10 = auVar19._8_8_;
              dVar20 = (dVar17 - dVar10) * dVar20 * dVar17 -
                       ((double)local_98 - (double)p_Var14) * (dVar10 + -1.0);
              dVar17 = (dVar15 + -1.0) * (dVar10 + -1.0) * (dVar17 + -1.0);
            }
            else {
              dVar17 = 1.0 - dVar15;
            }
            dVar20 = dVar20 * dVar15;
            dVar16 = -dVar20;
            dVar15 = dVar20;
            if (dVar20 <= dVar16) {
              dVar15 = dVar16;
            }
            dVar17 = (double)(~-(ulong)(dVar16 < dVar20) & (ulong)dVar17 |
                             (ulong)-dVar17 & -(ulong)(dVar16 < dVar20));
            dVar20 = (double)p_Var11 * 3.0 * dVar17 - ABS(dVar12 * dVar17);
            if (ABS((double)in_XMM1_Qa * dVar17) <= dVar20) {
              dVar20 = ABS((double)in_XMM1_Qa * dVar17);
            }
            if (dVar15 + dVar15 < dVar20) {
              local_48 = (N_Vector)(dVar15 / dVar17);
              local_70 = p_Var23;
              dStack_40 = dVar10;
            }
          }
          local_a0 = local_a8;
          in_XMM1_Qa = (N_Vector)ABS((double)local_48);
          dStack_60 = dVar13;
          if ((double)in_XMM1_Qa <= dVar12) {
            if ((double)p_Var11 <= 0.0) {
              local_68 = (N_Vector)((double)local_98 - dVar12);
              in_XMM1_Qa = local_68;
            }
            else {
              local_68 = (N_Vector)(dVar12 + (double)local_98);
              dStack_60 = ABS(dVar13);
            }
          }
          else {
            local_68 = (N_Vector)((double)local_98 + (double)local_48);
          }
          dStack_90 = dVar13;
          local_88 = p_Var25;
          local_58 = p_Var21;
          uStack_50 = uVar22;
          iVar8 = arkRelaxResidual((sunrealtype)local_68,(sunrealtype *)&local_a8,ark_mem);
          pAVar5 = ark_mem->relax_mem;
          plVar1 = &pAVar5->num_relax_fn_evals;
          *plVar1 = *plVar1 + 1;
          if (iVar8 < 0) goto LAB_0015caa6;
          dVar10 = 0.0;
          in_XMM1_Qa = local_70;
          if (iVar8 != 0) goto LAB_0015caa1;
          iVar9 = iVar9 + 1;
          p_Var11 = local_68;
          dVar12 = dStack_60;
          p_Var24 = local_58;
          uVar22 = uStack_50;
          p_Var23 = local_48;
          p_Var25 = local_88;
          p_Var14 = local_98;
          dVar13 = dStack_90;
        } while (iVar9 < pAVar5->max_iters);
      }
    }
  }
  iVar7 = 3;
  goto LAB_0015caa6;
LAB_0015caa1:
  iVar7 = 1;
  goto LAB_0015caa6;
LAB_0015c71b:
  pAVar3->res = (sunrealtype)p_Var24;
  pAVar3->relax_param = (sunrealtype)local_98;
LAB_0015c727:
  iVar7 = 0;
LAB_0015caa6:
  relax_fails = local_80;
  dsm_inout = local_78;
  if (iVar7 == 0) {
    in_XMM1_Qa = (N_Vector)ark_mem->relax_mem->relax_param;
    if (((double)in_XMM1_Qa < pAVar2->lower_bound) ||
       (pAVar2->upper_bound <= (double)in_XMM1_Qa && (double)in_XMM1_Qa != pAVar2->upper_bound)) {
      pAVar2->bound_fails = pAVar2->bound_fails + 1;
      iVar7 = 3;
    }
    else {
      pAVar2->relax_param_prev = pAVar2->relax_param;
      iVar7 = 0;
    }
  }
  else {
    pAVar2->nls_fails = pAVar2->nls_fails + 1;
  }
LAB_0015c25a:
  if (-1 < iVar7) {
    if (iVar7 == 0) {
      ark_mem->h = ark_mem->h * (double)in_XMM1_Qa;
      local_98 = in_XMM1_Qa;
      iVar7 = (*pAVar2->get_order_fn)(ark_mem);
      dVar10 = (double)SUNRpowerI(local_98,iVar7);
      *dsm_inout = dVar10 * *dsm_inout;
      N_VLinearSum(local_98,1.0 - (double)local_98,ark_mem->ycur,ark_mem->yn,ark_mem->ycur);
      iVar7 = 0;
    }
    else {
      pAVar2->num_fails = pAVar2->num_fails + 1;
      iVar9 = *relax_fails;
      *relax_fails = iVar9 + 1;
      iVar7 = -0x2b;
      if (((iVar9 + 1 != pAVar2->max_fails) && (ark_mem->hmin * 1.000001 < ABS(ark_mem->h))) &&
         (ark_mem->fixedstep == 0)) {
        ark_mem->eta = pAVar2->eta_fail;
        iVar7 = 5;
      }
    }
  }
  return iVar7;
}

Assistant:

int arkRelax(ARKodeMem ark_mem, int* relax_fails, sunrealtype* dsm_inout)
{
  int retval;
  sunrealtype relax_val;
  ARKodeRelaxMem relax_mem = ark_mem->relax_mem;

  /* Get the relaxation memory structure */
  if (!relax_mem)
  {
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_RELAX_MEM_NULL);
    return ARK_RELAX_MEM_NULL;
  }

  /* Compute the relaxation parameter */
  retval = arkRelaxSolve(ark_mem, relax_mem, &relax_val);
  if (retval < 0) { return retval; }
  if (retval > 0)
  {
    /* Update failure counts */
    relax_mem->num_fails++;
    (*relax_fails)++;

    /* Check for max fails in a step */
    if (*relax_fails == relax_mem->max_fails) { return ARK_RELAX_FAIL; }

    /* Return with an error if |h| == hmin */
    if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
    {
      return ARK_RELAX_FAIL;
    }

    /* Return with error if using fixed step sizes */
    if (ark_mem->fixedstep) { return (ARK_RELAX_FAIL); }

    /* Cut step size and try again */
    ark_mem->eta = relax_mem->eta_fail;

    return TRY_AGAIN;
  }

  /* Update step size and error estimate */
  ark_mem->h *= relax_val;
  *dsm_inout *= SUNRpowerI(relax_val, relax_mem->get_order_fn(ark_mem));

  /* Relax solution */
  N_VLinearSum(relax_val, ark_mem->ycur, (ONE - relax_val), ark_mem->yn,
               ark_mem->ycur);

  SUNLogDebug(ARK_LOGGER, "relaxation",
              "relaxation parameter = " SUN_FORMAT_G
              ", relaxed h = " SUN_FORMAT_G ", relaxed error = " SUN_FORMAT_G,
              relax_val, ark_mem->h, *dsm_inout);

  return ARK_SUCCESS;
}